

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O0

pair<ska::detailv3::sherwood_v3_table<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_slang::parsing::TokenKind,_std::hash<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::hash<slang::parsing::TokenKind>_>,_std::equal_to<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::equal_to<slang::parsing::TokenKind>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>_>::templated_iterator<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<slang::parsing::TokenKind,slang::parsing::Token>,slang::parsing::TokenKind,std::hash<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,slang::parsing::Token>,std::hash<slang::parsing::TokenKind>>,std::equal_to<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,slang::parsing::Token>,std::equal_to<slang::parsing::TokenKind>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,slang::parsing::Token>>,4ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,slang::parsing::Token>>,4ul>>
::emplace<slang::parsing::TokenKind&,slang::parsing::Token&>
          (sherwood_v3_table<std::pair<slang::parsing::TokenKind,slang::parsing::Token>,slang::parsing::TokenKind,std::hash<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,slang::parsing::Token>,std::hash<slang::parsing::TokenKind>>,std::equal_to<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,slang::parsing::Token>,std::equal_to<slang::parsing::TokenKind>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,slang::parsing::Token>>,4ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,slang::parsing::Token>>,4ul>>
           *this,TokenKind *key,Token *args)

{
  bool bVar1;
  size_t hash;
  undefined8 extraout_RDX;
  pair<ska::detailv3::sherwood_v3_table<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_slang::parsing::TokenKind,_std::hash<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::hash<slang::parsing::TokenKind>_>,_std::equal_to<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::equal_to<slang::parsing::TokenKind>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>_>::templated_iterator<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_bool>
  pVar2;
  pair<ska::detailv3::sherwood_v3_table<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_slang::parsing::TokenKind,_std::hash<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::hash<slang::parsing::TokenKind>_>,_std::equal_to<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::equal_to<slang::parsing::TokenKind>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>_>::templated_iterator<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_bool>
  pVar3;
  bool local_51;
  templated_iterator<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_> local_50;
  char local_41;
  EntryPointer psStack_40;
  int8_t distance_from_desired;
  EntryPointer current_entry;
  size_t index;
  Token *args_local;
  TokenKind *key_local;
  sherwood_v3_table<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_slang::parsing::TokenKind,_std::hash<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::hash<slang::parsing::TokenKind>_>,_std::equal_to<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::equal_to<slang::parsing::TokenKind>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>_>
  *this_local;
  bool local_10;
  
  index = (size_t)args;
  args_local = (Token *)key;
  key_local = (TokenKind *)this;
  hash = sherwood_v3_table<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_slang::parsing::TokenKind,_std::hash<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::hash<slang::parsing::TokenKind>_>,_std::equal_to<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::equal_to<slang::parsing::TokenKind>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>_>
         ::hash_object<slang::parsing::TokenKind>
                   ((sherwood_v3_table<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_slang::parsing::TokenKind,_std::hash<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::hash<slang::parsing::TokenKind>_>,_std::equal_to<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::equal_to<slang::parsing::TokenKind>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>_>
                     *)this,key);
  current_entry =
       (EntryPointer)
       fibonacci_hash_policy::index_for_hash
                 ((fibonacci_hash_policy *)(this + 0x18),hash,*(size_t *)(this + 0x10));
  psStack_40 = (EntryPointer)(*(long *)(this + 8) + (long)current_entry * 0x20);
  local_41 = '\0';
  do {
    if (psStack_40->distance_from_desired < local_41) {
      pVar2 = emplace_new_key<slang::parsing::TokenKind&,slang::parsing::Token&>
                        (this,local_41,psStack_40,&args_local->kind,(Token *)index);
      local_10 = pVar2.second;
LAB_0055eeda:
      this_local = (sherwood_v3_table<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_slang::parsing::TokenKind,_std::hash<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::hash<slang::parsing::TokenKind>_>,_std::equal_to<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::equal_to<slang::parsing::TokenKind>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>_>
                    *)pVar2.first.current;
      pVar3._9_7_ = pVar2._9_7_;
      pVar3.second = local_10;
      pVar3.first.current = (EntryPointer)this_local;
      return pVar3;
    }
    bVar1 = compares_equal<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,slang::parsing::Token>>
                      (this,&args_local->kind,&(psStack_40->field_1).value);
    if (bVar1) {
      sherwood_v3_table<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_slang::parsing::TokenKind,_std::hash<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::hash<slang::parsing::TokenKind>_>,_std::equal_to<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::equal_to<slang::parsing::TokenKind>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>_>
      ::templated_iterator<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>::
      templated_iterator(&local_50,psStack_40);
      local_51 = false;
      std::
      pair<ska::detailv3::sherwood_v3_table<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_slang::parsing::TokenKind,_std::hash<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::hash<slang::parsing::TokenKind>_>,_std::equal_to<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::equal_to<slang::parsing::TokenKind>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>_>::templated_iterator<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_bool>
      ::pair<bool,_true>((pair<ska::detailv3::sherwood_v3_table<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_slang::parsing::TokenKind,_std::hash<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::hash<slang::parsing::TokenKind>_>,_std::equal_to<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::equal_to<slang::parsing::TokenKind>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>_>::templated_iterator<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_bool>
                          *)&this_local,&local_50,&local_51);
      pVar2._8_8_ = extraout_RDX;
      pVar2.first.current = (EntryPointer)this_local;
      goto LAB_0055eeda;
    }
    psStack_40 = psStack_40 + 1;
    local_41 = local_41 + '\x01';
  } while( true );
}

Assistant:

std::pair<iterator, bool> emplace(Key && key, Args &&... args)
    {
        size_t index = hash_policy.index_for_hash(hash_object(key), num_slots_minus_one);
        EntryPointer current_entry = entries + ptrdiff_t(index);
        int8_t distance_from_desired = 0;
        for (; current_entry->distance_from_desired >= distance_from_desired; ++current_entry, ++distance_from_desired)
        {
            if (compares_equal(key, current_entry->value))
                return { { current_entry }, false };
        }
        return emplace_new_key(distance_from_desired, current_entry, std::forward<Key>(key), std::forward<Args>(args)...);
    }